

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraCodeBlocksGenerator.cxx
# Opt level: O0

int __thiscall
cmExtraCodeBlocksGenerator::GetCBTargetType
          (cmExtraCodeBlocksGenerator *this,cmGeneratorTarget *target)

{
  cmGeneratorTarget *pcVar1;
  bool bVar2;
  TargetType TVar3;
  bool local_92;
  allocator local_79;
  string local_78;
  allocator local_41;
  string local_40;
  cmGeneratorTarget *local_20;
  cmGeneratorTarget *target_local;
  cmExtraCodeBlocksGenerator *this_local;
  
  local_20 = target;
  target_local = (cmGeneratorTarget *)this;
  TVar3 = cmGeneratorTarget::GetType(target);
  pcVar1 = local_20;
  if (TVar3 == EXECUTABLE) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_40,"WIN32_EXECUTABLE",&local_41);
    bVar2 = cmGeneratorTarget::GetPropertyAsBool(pcVar1,&local_40);
    pcVar1 = local_20;
    local_92 = true;
    if (!bVar2) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_78,"MACOSX_BUNDLE",&local_79);
      local_92 = cmGeneratorTarget::GetPropertyAsBool(pcVar1,&local_78);
      std::__cxx11::string::~string((string *)&local_78);
      std::allocator<char>::~allocator((allocator<char> *)&local_79);
    }
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
    if (local_92 == false) {
      this_local._4_4_ = 1;
    }
    else {
      this_local._4_4_ = 0;
    }
  }
  else {
    TVar3 = cmGeneratorTarget::GetType(local_20);
    if ((TVar3 == STATIC_LIBRARY) ||
       (TVar3 = cmGeneratorTarget::GetType(local_20), TVar3 == OBJECT_LIBRARY)) {
      this_local._4_4_ = 2;
    }
    else {
      TVar3 = cmGeneratorTarget::GetType(local_20);
      if ((TVar3 == SHARED_LIBRARY) ||
         (TVar3 = cmGeneratorTarget::GetType(local_20), TVar3 == MODULE_LIBRARY)) {
        this_local._4_4_ = 3;
      }
      else {
        this_local._4_4_ = 4;
      }
    }
  }
  return this_local._4_4_;
}

Assistant:

int cmExtraCodeBlocksGenerator::GetCBTargetType(cmGeneratorTarget* target)
{
  if ( target->GetType()==cmState::EXECUTABLE)
    {
    if ((target->GetPropertyAsBool("WIN32_EXECUTABLE"))
        || (target->GetPropertyAsBool("MACOSX_BUNDLE")))
      {
      return 0;
      }
    else
      {
      return 1;
      }
    }
  else if (( target->GetType()==cmState::STATIC_LIBRARY)
        || (target->GetType()==cmState::OBJECT_LIBRARY))
    {
    return 2;
    }
  else if ((target->GetType()==cmState::SHARED_LIBRARY)
           || (target->GetType()==cmState::MODULE_LIBRARY))
    {
    return 3;
    }
  return 4;
}